

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  byte bVar2;
  double dVar3;
  char cVar4;
  bool bVar5;
  undefined1 uVar6;
  bool bVar7;
  char *pcVar8;
  int *piVar9;
  xml_attribute xVar10;
  long lVar11;
  xpath_memory_block *pxVar12;
  byte bVar13;
  xpath_ast_node *pxVar14;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar15;
  byte bVar16;
  char_t *src;
  less_equal *in_R8;
  xml_node_struct *pxVar17;
  int *dst;
  undefined1 local_f4;
  double v;
  xpath_memory_block *local_e8;
  size_t sStack_e0;
  bool *local_d8;
  xpath_node_set_raw local_d0;
  double local_b0;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  
  local_f4 = xpath_type_none;
LAB_00156135:
  cVar4 = this->_type;
  lVar11 = 0x10;
  switch(cVar4) {
  case '\x01':
    bVar5 = eval_boolean(this->_left,c,stack);
    if (bVar5) {
switchD_00156180_caseD_2f:
      uVar6 = xpath_type_node_set;
      goto LAB_00156b9e;
    }
    break;
  case '\x02':
    bVar5 = eval_boolean(this->_left,c,stack);
    if (!bVar5) goto switchD_00156180_caseD_30;
    break;
  case '\x03':
    goto switchD_00156149_caseD_3;
  case '\x04':
    pxVar14 = this->_left;
    this = this->_right;
    cVar4 = pxVar14->_rettype;
    cVar1 = this->_rettype;
    if ((cVar4 != '\x01') && (cVar1 != '\x01')) {
      if (cVar4 == '\x04' || cVar1 == '\x04') goto code_r0x001561db;
      if (cVar4 == '\x02' || cVar1 == '\x02') {
        local_b0 = eval_number(pxVar14,c,stack);
        dVar3 = eval_number(this,c,stack);
        uVar6 = dVar3 != local_b0;
        goto LAB_00156b9e;
      }
      if (cVar4 != '\x03' && cVar1 != '\x03') goto switchD_00156180_caseD_30;
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,pxVar14,c,stack);
      eval_string((xpath_string *)&local_a8,this,c,stack);
      bVar5 = strequal((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
      uVar6 = !bVar5;
      goto LAB_001565e6;
    }
    if (cVar1 == '\x01' && cVar4 == '\x01') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_d0,pxVar14,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
      for (; uVar6 = local_d0._begin != local_d0._end,
          pxVar12 = (xpath_memory_block *)local_a8._begin, (bool)uVar6;
          local_d0._begin = local_d0._begin + 1) {
        while (pxVar12 != (xpath_memory_block *)local_a8._end) {
          local_80._target = stack->result;
          local_80._state._error = (local_80._target)->_error;
          local_80._state._root = (local_80._target)->_root;
          local_80._state._root_size = (local_80._target)->_root_size;
          string_value(&local_60,local_d0._begin,local_80._target);
          string_value(&local_48,(xpath_node *)pxVar12,stack->result);
          bVar5 = strequal(local_60._buffer,local_48._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_80);
          pxVar12 = (xpath_memory_block *)&pxVar12->field_2;
          if (!bVar5) goto LAB_001565e6;
        }
      }
      goto LAB_001565e6;
    }
    pxVar15 = pxVar14;
    if (cVar4 == '\x01') {
      pxVar15 = this;
      cVar4 = cVar1;
      this = pxVar14;
    }
    if (cVar4 == '\x02') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      local_88 = eval_number(pxVar15,c,stack);
      eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
      goto LAB_00156cc6;
    }
    if (cVar4 == '\x03') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_80,pxVar15,c,stack);
      eval_node_set(&local_d0,this,c,stack,nodeset_eval_all);
      goto LAB_00156c0a;
    }
    if (cVar4 != '\x04') goto switchD_00156180_caseD_30;
    bVar5 = eval_boolean(pxVar15,c,stack);
    bVar7 = eval_boolean(this,c,stack);
    local_f4 = local_f4 ^ bVar7 != bVar5;
    goto LAB_00156ba5;
  case '\x05':
    pxVar15 = this->_left;
    pxVar14 = this->_right;
    goto LAB_00156340;
  case '\x06':
    pxVar14 = this->_left;
    pxVar15 = this->_right;
LAB_00156340:
    uVar6 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                      (pxVar15,pxVar14,c,stack,(less *)in_R8);
    goto LAB_00156b9e;
  case '\a':
    pxVar15 = this->_left;
    pxVar14 = this->_right;
    goto LAB_0015632b;
  case '\b':
    pxVar14 = this->_left;
    pxVar15 = this->_right;
LAB_0015632b:
    uVar6 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                      (pxVar15,pxVar14,c,stack,in_R8);
    goto LAB_00156b9e;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_00156149_caseD_9;
  case '\x14':
    cVar4 = this->_rettype;
    if (cVar4 != '\x04') goto LAB_001562d0;
    if (((this->_data).variable)->_type != xpath_type_boolean) goto switchD_00156180_caseD_30;
    uVar6 = (undefined1)(this->_data).variable[1]._type;
    goto LAB_00156b9e;
  default:
    lVar11 = 8;
    switch(cVar4) {
    case '\"':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      uVar6 = starts_with((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
      goto LAB_001565e6;
    case '#':
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      pcVar8 = strstr((char *)local_d0._0_8_,(char *)local_a8._0_8_);
      bVar5 = pcVar8 == (char *)0x0;
      goto LAB_001565e2;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_00156149_caseD_9;
    case '-':
      break;
    case '.':
      bVar5 = eval_boolean(this->_left,c,stack);
      goto LAB_0015646c;
    case '/':
      goto switchD_00156180_caseD_2f;
    case '0':
      goto switchD_00156180_caseD_30;
    case '1':
      if ((c->n)._attribute._attr != (xml_attribute_struct *)0x0) goto switchD_00156180_caseD_30;
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,this->_left,c,stack);
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        pxVar17 = (c->n)._node._root;
      }
      else {
        pxVar17 = (xml_node_struct *)0x0;
      }
      goto LAB_001566a6;
    default:
      if (cVar4 == ';') {
        dst = (int *)(this->_right->_data).string;
        if (this->_right->_type != '\x12') {
          if (*dst == 3) {
            piVar9 = *(int **)(dst + 4);
          }
          else {
            piVar9 = (int *)0x0;
          }
          dst = (int *)0x161d69;
          if (piVar9 != (int *)0x0) {
            dst = piVar9;
          }
        }
        uVar6 = xpath_type_none;
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          v = (double)(c->n)._node._root;
        }
        else {
          v = 0.0;
        }
        xVar10 = xml_node::attribute((xml_node *)&v,(this->_left->_data).string);
        if (xVar10._attr == (xml_attribute_struct *)0x0) goto LAB_00156b9e;
        src = (xVar10._attr)->value;
        if (src == (char_t *)0x0) {
          src = "";
        }
        bVar5 = strequal(src,(char_t *)dst);
        if (!bVar5) goto switchD_00156180_caseD_30;
        pcVar8 = "";
        if ((xVar10._attr)->name != (char_t *)0x0) {
          pcVar8 = (xVar10._attr)->name;
        }
        uVar6 = is_xpath_attribute(pcVar8);
        goto LAB_00156b9e;
      }
switchD_00156149_caseD_9:
      cVar4 = this->_rettype;
LAB_001562d0:
      if (cVar4 == '\x01') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_node_set(&local_d0,this,c,stack,nodeset_eval_any);
        bVar5 = local_d0._begin == local_d0._end;
      }
      else {
        if (cVar4 != '\x03') {
          if (cVar4 != '\x02') goto switchD_00156180_caseD_30;
          dVar3 = eval_number(this,c,stack);
          if ((dVar3 == 0.0) && (!NAN(dVar3))) goto switchD_00156180_caseD_30;
          uVar6 = xpath_type_node_set;
          goto LAB_00156b9e;
        }
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_d0,this,c,stack);
        bVar5 = *(char *)local_d0._0_8_ == '\0';
      }
LAB_001565e2:
      uVar6 = !bVar5;
      goto LAB_001565e6;
    }
  }
  this = *(xpath_ast_node **)(&this->_type + lVar11);
  goto LAB_00156135;
LAB_001566a6:
  local_a8._0_8_ = pxVar17;
  if (pxVar17 == (xml_node_struct *)0x0) goto LAB_001567a0;
  xVar10 = xml_node::attribute((xml_node *)&local_a8,"xml:lang");
  if (xVar10._attr != (xml_attribute_struct *)0x0) {
    pcVar8 = "";
    if ((xVar10._attr)->value != (char *)0x0) {
      pcVar8 = (xVar10._attr)->value;
    }
    lVar11 = 0;
    goto LAB_0015675f;
  }
  pxVar17 = pxVar17->parent;
  goto LAB_001566a6;
LAB_0015675f:
  bVar2 = *(byte *)(local_d0._0_8_ + lVar11);
  if (bVar2 == 0) goto LAB_0015680e;
  bVar13 = bVar2 | 0x20;
  if (0x19 < (int)(char)bVar2 - 0x41U) {
    bVar13 = bVar2;
  }
  bVar2 = pcVar8[lVar11];
  bVar16 = bVar2 | 0x20;
  if (0x19 < (int)(char)bVar2 - 0x41U) {
    bVar16 = bVar2;
  }
  if (bVar13 != bVar16) goto LAB_001567a0;
  lVar11 = lVar11 + 1;
  goto LAB_0015675f;
LAB_0015680e:
  uVar6 = pcVar8[lVar11] == '-' || pcVar8[lVar11] == '\0';
  goto LAB_001565e6;
LAB_001567a0:
  uVar6 = false;
  goto LAB_001565e6;
LAB_00156cc6:
  uVar6 = local_d0._begin != local_d0._end;
  if (local_d0._begin == local_d0._end) goto LAB_001565e6;
  local_a8._0_8_ = stack->result;
  local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
  local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
  local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
  string_value((xpath_string *)&local_80,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
  local_b0 = convert_string_to_number((char_t *)local_80._target);
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
  local_d0._begin = local_d0._begin + 1;
  if ((local_88 != local_b0) || (NAN(local_88) || NAN(local_b0))) goto LAB_001565e6;
  goto LAB_00156cc6;
code_r0x001561db:
  bVar5 = eval_boolean(pxVar14,c,stack);
  local_f4 = local_f4 ^ bVar5;
  goto LAB_00156135;
switchD_00156149_caseD_3:
  pxVar14 = this->_left;
  pxVar15 = this->_right;
  cVar4 = pxVar14->_rettype;
  cVar1 = pxVar15->_rettype;
  if (cVar1 == '\x01' || cVar4 == '\x01') {
    if (cVar1 == '\x01' && cVar4 == '\x01') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_node_set(&local_d0,pxVar14,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,pxVar15,c,stack,nodeset_eval_all);
      for (; uVar6 = local_d0._begin != local_d0._end,
          pxVar12 = (xpath_memory_block *)local_a8._begin, (bool)uVar6;
          local_d0._begin = local_d0._begin + 1) {
        while (pxVar12 != (xpath_memory_block *)local_a8._end) {
          local_80._target = stack->result;
          local_80._state._error = (local_80._target)->_error;
          local_80._state._root = (local_80._target)->_root;
          local_80._state._root_size = (local_80._target)->_root_size;
          string_value(&local_60,local_d0._begin,local_80._target);
          string_value(&local_48,(xpath_node *)pxVar12,stack->result);
          bVar5 = strequal(local_60._buffer,local_48._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_80);
          pxVar12 = (xpath_memory_block *)&pxVar12->field_2;
          if (bVar5) goto LAB_001565e6;
        }
      }
    }
    else {
      this_00 = pxVar14;
      if (cVar4 == '\x01') {
        this_00 = pxVar15;
        cVar4 = cVar1;
        pxVar15 = pxVar14;
      }
      if (cVar4 == '\x02') {
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        local_88 = eval_number(this_00,c,stack);
        eval_node_set(&local_d0,pxVar15,c,stack,nodeset_eval_all);
        do {
          uVar6 = local_d0._begin != local_d0._end;
          if (local_d0._begin == local_d0._end) break;
          local_a8._0_8_ = stack->result;
          local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
          local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
          local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
          string_value((xpath_string *)&local_80,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
          local_b0 = convert_string_to_number((char_t *)local_80._target);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
          local_d0._begin = local_d0._begin + 1;
        } while ((local_88 != local_b0) || (NAN(local_88) || NAN(local_b0)));
      }
      else {
        if (cVar4 != '\x03') {
          if (cVar4 != '\x04') goto switchD_00156180_caseD_30;
          bVar7 = eval_boolean(this_00,c,stack);
          goto LAB_00156285;
        }
        v = (double)stack->result;
        local_e8 = ((xpath_allocator *)v)->_root;
        sStack_e0 = ((xpath_allocator *)v)->_root_size;
        local_d8 = ((xpath_allocator *)v)->_error;
        eval_string((xpath_string *)&local_80,this_00,c,stack);
        eval_node_set(&local_d0,pxVar15,c,stack,nodeset_eval_all);
        do {
          uVar6 = local_d0._begin != local_d0._end;
          if (local_d0._begin == local_d0._end) break;
          local_a8._0_8_ = stack->result;
          local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
          local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
          local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
          string_value(&local_60,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
          bVar5 = strequal((char_t *)local_80._target,local_60._buffer);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
          local_d0._begin = local_d0._begin + 1;
        } while (!bVar5);
      }
    }
    goto LAB_001565e6;
  }
  if (cVar1 == '\x04' || cVar4 == '\x04') {
    bVar7 = eval_boolean(pxVar14,c,stack);
LAB_00156285:
    bVar5 = eval_boolean(pxVar15,c,stack);
    bVar5 = (bool)(bVar5 ^ bVar7);
LAB_0015646c:
    local_f4 = bVar5 ^ local_f4 ^ xpath_type_node_set;
    goto LAB_00156ba5;
  }
  if (cVar4 == '\x02' || cVar1 == '\x02') {
    local_b0 = eval_number(pxVar14,c,stack);
    dVar3 = eval_number(pxVar15,c,stack);
    uVar6 = dVar3 == local_b0;
  }
  else {
    if (cVar4 == '\x03' || cVar1 == '\x03') {
      v = (double)stack->result;
      local_e8 = ((xpath_allocator *)v)->_root;
      sStack_e0 = ((xpath_allocator *)v)->_root_size;
      local_d8 = ((xpath_allocator *)v)->_error;
      eval_string((xpath_string *)&local_d0,pxVar14,c,stack);
      eval_string((xpath_string *)&local_a8,pxVar15,c,stack);
      uVar6 = strequal((char_t *)local_d0._0_8_,(char_t *)local_a8._0_8_);
      goto LAB_001565e6;
    }
switchD_00156180_caseD_30:
    uVar6 = xpath_type_none;
  }
  goto LAB_00156b9e;
  while( true ) {
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value(&local_60,local_d0._begin,(xpath_allocator *)local_a8._0_8_);
    bVar5 = strequal((char_t *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    local_d0._begin = local_d0._begin + 1;
    if (!bVar5) break;
LAB_00156c0a:
    uVar6 = local_d0._begin != local_d0._end;
    if (local_d0._begin == local_d0._end) break;
  }
LAB_001565e6:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&v);
LAB_00156b9e:
  local_f4 = local_f4 ^ uVar6;
LAB_00156ba5:
  return (bool)(local_f4 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != NULL;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}